

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,char *__filename)

{
  Node *pNVar1;
  TermList val;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  Term *pTVar5;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**> *pSVar6;
  TermList *pTVar7;
  Top TVar8;
  IntermediateNode *parent;
  Node *node;
  TermList term;
  Leaf *lnode;
  TermList *tt;
  Stack<Kernel::TermList_*> subterms;
  TermList *ss;
  TermList *s;
  TermList t;
  uint boundVar;
  IntermediateNode *inode;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  Node **pnode;
  undefined4 in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
  *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  Stack<Kernel::TermList_*> *in_stack_fffffffffffffdd0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
  *in_stack_fffffffffffffdd8;
  long *plVar9;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  TermList *in_stack_fffffffffffffdf0;
  Node *in_stack_fffffffffffffe00;
  undefined1 local_100 [48];
  Node *local_d0;
  uint64_t local_c8;
  TermList *local_c0;
  Stack<Kernel::TermList_*> local_b8;
  TermList *local_98;
  TermList *local_90;
  undefined8 local_88;
  uint local_80;
  undefined8 local_78;
  uint local_70;
  undefined8 local_68;
  uint local_60;
  TermList local_58;
  undefined4 local_4c;
  Node *local_48;
  Node **local_20;
  char *local_10;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *local_8;
  
  local_20 = &this->_root;
  local_10 = __filename;
  local_8 = this;
  Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffdc0);
  while (iVar3 = (*(*local_20)->_vptr_Node[2])(), (((byte)iVar3 ^ 0xff) & 1) != 0) {
    Lib::
    Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x466de4);
    Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>::
    push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
          *)in_stack_fffffffffffffdc0,
         (Node **)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_48 = *local_20;
    local_4c = *(undefined4 *)&local_48[1]._vptr_Node;
    pTVar7 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                       (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    pNVar1 = local_48;
    local_58._content = pTVar7->_content;
    TVar8 = Kernel::TermList::top(in_stack_fffffffffffffdf0);
    local_88 = TVar8._inner._inner._0_8_;
    local_70 = CONCAT31(local_70._1_3_,TVar8._inner._inner._content[7]);
    local_60 = local_70;
    local_80 = local_70;
    local_78 = local_88;
    local_68 = local_88;
    iVar3 = (*pNVar1->_vptr_Node[10])(pNVar1,local_88,(ulong)local_70,0);
    local_20 = (Node **)CONCAT44(extraout_var,iVar3);
    local_90 = Node::term(*local_20);
    bVar2 = Kernel::TermList::operator==(local_90,&local_58);
    if (!bVar2) {
      pTVar5 = Kernel::TermList::term((TermList *)0x466f7d);
      local_98 = Kernel::Term::args(pTVar5);
      Lib::Stack<Kernel::TermList_*>::Stack(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                 (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      pTVar5 = Kernel::TermList::term((TermList *)0x466fd4);
      Kernel::Term::args(pTVar5);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                 (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      while (bVar2 = Lib::Stack<Kernel::TermList_*>::isEmpty(&local_b8), ((bVar2 ^ 0xffU) & 1) != 0)
      {
        local_c0 = Lib::Stack<Kernel::TermList_*>::pop(&local_b8);
        local_98 = Lib::Stack<Kernel::TermList_*>::pop(&local_b8);
        Kernel::TermList::next(local_c0);
        bVar2 = Kernel::TermList::isEmpty((TermList *)0x46705e);
        if (!bVar2) {
          Kernel::TermList::next(local_98);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                     (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          Kernel::TermList::next(local_c0);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                     (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        }
        bVar2 = Kernel::TermList::operator==(local_98,local_c0);
        if (!bVar2) {
          bVar2 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffdc0);
          if (bVar2) {
            Kernel::TermList::var(local_98);
            local_c8 = local_c0->_content;
            val._content._7_1_ = in_stack_fffffffffffffde7;
            val._content._0_7_ = in_stack_fffffffffffffde0;
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      (in_stack_fffffffffffffdd8,(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                       val);
          }
          else {
            pTVar5 = Kernel::TermList::term((TermList *)0x46717a);
            local_98 = Kernel::Term::args(pTVar5);
            bVar2 = Kernel::TermList::isEmpty((TermList *)0x4671a6);
            if (!bVar2) {
              Lib::Stack<Kernel::TermList_*>::push
                        ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                         (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
              pTVar5 = Kernel::TermList::term((TermList *)0x4671da);
              Kernel::Term::args(pTVar5);
              Lib::Stack<Kernel::TermList_*>::push
                        ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0,
                         (TermList *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
            }
          }
        }
      }
      Lib::Stack<Kernel::TermList_*>::~Stack((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffdc0)
      ;
    }
  }
  pNVar1 = *local_20;
  local_d0 = pNVar1;
  Inferences::ALASCA::BinaryResolutionConf::Rhs::Rhs
            ((Rhs *)in_stack_fffffffffffffdc0,
             (Rhs *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  (*pNVar1->_vptr_Node[10])(pNVar1,local_100);
  Inferences::ALASCA::BinaryResolutionConf::Rhs::~Rhs((Rhs *)0x467272);
  ensureLeafEfficiency((Leaf **)0x46727f);
  do {
    uVar4 = (*(*local_20)->_vptr_Node[3])();
    if ((uVar4 & 1) == 0) {
LAB_004674ad:
      Lib::
      Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffffe00);
      return extraout_EAX;
    }
    Node::term(*local_20);
    pSVar6 = Lib::
             Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x4672d2);
    bVar2 = Lib::
            Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
            ::isEmpty(pSVar6);
    if (bVar2) {
      in_stack_fffffffffffffe00 = *local_20;
      if (in_stack_fffffffffffffe00 != (Node *)0x0) {
        (*in_stack_fffffffffffffe00->_vptr_Node[1])();
      }
      *local_20 = (Node *)0x0;
      goto LAB_004674ad;
    }
    pNVar1 = *local_20;
    pSVar6 = Lib::
             Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x467379);
    pTVar7 = (TermList *)
             Lib::
             Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
             ::top(pSVar6);
    plVar9 = *(long **)pTVar7->_content;
    TVar8 = Kernel::TermList::top(pTVar7);
    (**(code **)(*plVar9 + 0x58))(plVar9,TVar8._inner._inner._0_8_,TVar8._inner._inner._content[7]);
    if (pNVar1 != (Node *)0x0) {
      (*pNVar1->_vptr_Node[1])();
    }
    pSVar6 = Lib::
             Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x467467);
    local_20 = Lib::
               Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
               ::pop(pSVar6);
    ensureIntermediateNodeEfficiency((IntermediateNode **)0x467499);
  } while( true );
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}